

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataStatePtr
xmlAutomataNewNegTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,
          xmlChar *token2,void *data)

{
  int iVar1;
  int iVar2;
  xmlRegAtomPtr atom;
  size_t sVar3;
  size_t sVar4;
  void *__dest;
  xmlChar *pxVar5;
  xmlChar err_msg [200];
  xmlChar local_f8 [199];
  undefined1 local_31;
  
  if ((token != (xmlChar *)0x0 && (from != (xmlAutomataStatePtr)0x0 && am != (xmlAutomataPtr)0x0))
     && (atom = xmlRegNewAtom(am,XML_REGEXP_STRING), atom != (xmlRegAtomPtr)0x0)) {
    atom->data = data;
    atom->neg = 1;
    if ((token2 == (xmlChar *)0x0) || (*token2 == '\0')) {
      pxVar5 = xmlStrdup(token);
      atom->valuep = pxVar5;
    }
    else {
      sVar3 = strlen((char *)token2);
      sVar4 = strlen((char *)token);
      iVar2 = (int)sVar4;
      iVar1 = (int)sVar3;
      __dest = (*xmlMalloc)((long)(iVar2 + iVar1 + 2));
      if (__dest == (void *)0x0) {
        xmlRegFreeAtom(atom);
        return (xmlAutomataStatePtr)0x0;
      }
      memcpy(__dest,token,(long)iVar2);
      *(undefined1 *)((long)__dest + (long)iVar2) = 0x7c;
      memcpy((void *)((long)(iVar2 + 1) + (long)__dest),token2,(long)iVar1);
      *(undefined1 *)((long)__dest + (long)(iVar1 + iVar2) + 1) = 0;
      atom->valuep = __dest;
    }
    snprintf((char *)local_f8,199,"not %s",atom->valuep);
    local_31 = 0;
    pxVar5 = xmlStrdup(local_f8);
    atom->valuep2 = pxVar5;
    iVar2 = xmlFAGenerateTransitions(am,from,to,atom);
    if (-1 < iVar2) {
      am->negs = am->negs + 1;
      if (to == (xmlAutomataStatePtr)0x0) {
        return am->state;
      }
      return to;
    }
    xmlRegFreeAtom(atom);
  }
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewNegTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		       xmlAutomataStatePtr to, const xmlChar *token,
		       const xmlChar *token2, void *data) {
    xmlRegAtomPtr atom;
    xmlChar err_msg[200];

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->data = data;
    atom->neg = 1;
    if ((token2 == NULL) || (*token2 == 0)) {
	atom->valuep = xmlStrdup(token);
    } else {
	int lenn, lenp;
	xmlChar *str;

	lenn = strlen((char *) token2);
	lenp = strlen((char *) token);

	str = xmlMalloc(lenn + lenp + 2);
	if (str == NULL) {
	    xmlRegFreeAtom(atom);
	    return(NULL);
	}
	memcpy(&str[0], token, lenp);
	str[lenp] = '|';
	memcpy(&str[lenp + 1], token2, lenn);
	str[lenn + lenp + 1] = 0;

	atom->valuep = str;
    }
    snprintf((char *) err_msg, 199, "not %s", (const char *) atom->valuep);
    err_msg[199] = 0;
    atom->valuep2 = xmlStrdup(err_msg);

    if (xmlFAGenerateTransitions(am, from, to, atom) < 0) {
        xmlRegFreeAtom(atom);
	return(NULL);
    }
    am->negs++;
    if (to == NULL)
	return(am->state);
    return(to);
}